

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

void Set_Value_Into_String(Am_Value *value)

{
  char cVar1;
  ostream *poVar2;
  char line [100];
  ostrstream oss;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Value is `");
  poVar2 = (ostream *)operator<<(poVar2,value);
  poVar2 = std::operator<<(poVar2,"\'");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  cVar1 = Am_Value::Valid();
  if (cVar1 != '\0') {
    std::ostrstream::ostrstream(&oss,line,100,_S_out);
    poVar2 = std::operator<<((ostream *)&oss,"Value is `");
    poVar2 = (ostream *)operator<<(poVar2,value);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ends<char,std::char_traits<char>>(poVar2);
    Am_Object::Set(0x9298,(char *)0xab,(ulong)line);
    std::ostrstream::~ostrstream(&oss);
  }
  return;
}

Assistant:

void Set_Value_Into_String(Am_Value &value) {
  cout << "Value is `" << value << "'" << endl << flush;
  if (value.Valid()) { //otherwise, user hit Cancel
    char line[100];
    OSTRSTREAM_CONSTR (oss,line, 100, ios::out);
    oss << "Value is `" << value << "'" << ends;
    OSTRSTREAM_COPY(oss,line,100);
    pop_up_value_string.Set(Am_TEXT, line);
  }
}